

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

Vec_Int_t * Saig_TsiComputeTransient(Saig_Tsim_t *p,int nPref)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar1 = p->pAig->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < nPref - 1U) {
    iVar5 = nPref;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = nPref;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)nPref << 2);
  }
  if (0 < (int)uVar1) {
    pVVar2 = p->vStates;
    uVar6 = 0;
    uVar9 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      uVar10 = (ulong)pVVar2->nSize;
      if (0 < (long)uVar10) {
        uVar11 = uVar6 * 2 & 0x1e;
        uVar12 = 0;
        uVar8 = uVar9;
        do {
          pvVar3 = pVVar2->pArray[uVar12];
          uVar9 = (uint)((*(uint *)((long)pvVar3 + (ulong)(uVar6 >> 4) * 4) >> uVar11 & 1) != 0) |
                  (*(uint *)((long)pvVar3 + (ulong)(uVar6 >> 4) * 4) >> ((char)uVar11 + 1U & 0x1f))
                  * 2 & 2;
          if (uVar9 == 0) {
            __assert_fail("ValueThis != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigPhase.c"
                          ,0x10f,"Vec_Int_t *Saig_TsiComputeTransient(Saig_Tsim_t *, int)");
          }
          if (uVar8 != uVar9) {
            uVar7 = uVar12 & 0xffffffff;
          }
          uVar12 = uVar12 + 1;
          uVar8 = uVar9;
        } while (uVar10 != uVar12);
      }
      if ((uVar9 != 3) && ((int)uVar7 < nPref)) {
        if ((int)uVar7 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar7] = __s[uVar7] + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Saig_TsiComputeTransient( Saig_Tsim_t * p, int nPref )
{
    Vec_Int_t * vCounters;
    unsigned * pState;
    int ValueThis = -1, ValuePrev = -1, StepPrev = -1;
    int i, k, nRegs = p->pAig->nRegs;
    vCounters = Vec_IntStart( nPref );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            ValueThis = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
//printf( "%s", (ValueThis == 1)? "0" : ((ValueThis == 2)? "1" : "x") );
            assert( ValueThis != 0 );
            if ( ValuePrev != ValueThis )
            {
                ValuePrev = ValueThis;
                StepPrev  = k;
            }
        }
//printf( "\n" );
        if ( ValueThis == SAIG_XVSX )
            continue;
        if ( StepPrev >= nPref )
            continue;
        Vec_IntAddToEntry( vCounters, StepPrev, 1 );
    }
    Vec_IntForEachEntry( vCounters, ValueThis, i )
    {
        if ( ValueThis == 0 )
            continue;
//        printf( "%3d : %3d\n", i, ValueThis );
    }
    return vCounters;
}